

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O1

void __thiscall
slang::syntax::SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::MultipleRewriter>::
visit<slang::syntax::TypedefDeclarationSyntax&>
          (SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::MultipleRewriter> *this,
          TypedefDeclarationSyntax *t)

{
  Token *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Symbol *pSVar2;
  SyntaxNode *pSVar3;
  char *pcVar5;
  string_view sVar6;
  StringRef macroName;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  StringRef capturedExpression;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  EnumType *type;
  AssertionHandler catchAssertionHandler;
  string local_c0;
  Symbol *local_a0;
  AssertionHandler local_98;
  ITransientExpression local_48;
  Symbol **local_38;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar4;
  
  pSVar3 = (SyntaxNode *)(t->type).ptr;
  if (pSVar3->kind == EnumType) {
    local_a0 = SemanticModel::getDeclaredSymbol((SemanticModel *)(this + 0xd80),pSVar3);
    local_c0._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/VisitorTests.cpp"
    ;
    local_c0._M_string_length = 0x130;
    macroName.m_size = 7;
    macroName.m_start = "REQUIRE";
    capturedExpression.m_size = 4;
    capturedExpression.m_start = "type";
    aVar4 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)0x4;
    Catch::AssertionHandler::AssertionHandler
              (&local_98,macroName,(SourceLineInfo *)&local_c0,capturedExpression,Normal);
    local_48.m_result = local_a0 != (Symbol *)0x0;
    local_48.m_isBinaryExpression = false;
    local_48._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00cb6980;
    local_38 = &local_a0;
    Catch::AssertionHandler::handleExpr(&local_98,&local_48);
    Catch::AssertionHandler::complete(&local_98);
    if (local_98.m_completed == false) {
      (*(local_98.m_resultCapture)->_vptr_IResultCapture[0x14])();
    }
    pSVar2 = local_a0;
    if (*(int *)&local_a0[1].originatingSyntax != 0) {
      ast::Scope::elaborate((Scope *)&local_a0[1].name._M_str);
    }
    pcVar5 = (char *)0x0;
    for (pSVar2 = pSVar2[1].nextInScope; pSVar2 != (Symbol *)0x0; pSVar2 = pSVar2->nextInScope) {
      pcVar5 = pcVar5 + 1;
    }
    this_00 = &t->name;
    sVar6 = parsing::Token::valueText(this_00);
    local_98.m_assertionInfo.macroName.m_start = sVar6._M_str;
    local_98.m_assertionInfo.macroName.m_size = sVar6._M_len;
    fmt.size_ = 0x4d;
    fmt.data_ = (char *)0x24;
    args.field_1.args_ = aVar4.args_;
    args.desc_ = (unsigned_long_long)&local_98;
    local_98.m_assertionInfo.lineInfo.file = pcVar5;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_c0,(v11 *)"\n    localparam int {}__count1 = {};",fmt,args);
    sVar6._M_str = local_c0._M_dataplus._M_p;
    sVar6._M_len = local_c0._M_string_length;
    pSVar3 = SyntaxRewriter<MultipleRewriter>::parse((SyntaxRewriter<MultipleRewriter> *)this,sVar6)
    ;
    paVar1 = &local_c0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    SyntaxRewriter<MultipleRewriter>::insertBefore
              ((SyntaxRewriter<MultipleRewriter> *)this,(SyntaxNode *)t,pSVar3);
    sVar6 = parsing::Token::valueText(this_00);
    local_98.m_assertionInfo.macroName.m_start = sVar6._M_str;
    local_98.m_assertionInfo.macroName.m_size = sVar6._M_len;
    fmt_00.size_ = 0x4d;
    fmt_00.data_ = (char *)0x24;
    args_00.field_1.args_ = aVar4.args_;
    args_00.desc_ = (unsigned_long_long)&local_98;
    local_98.m_assertionInfo.lineInfo.file = pcVar5;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_c0,(v11 *)"\n    localparam int {}__count2 = {};",fmt_00,args_00);
    text._M_str = local_c0._M_dataplus._M_p;
    text._M_len = local_c0._M_string_length;
    pSVar3 = SyntaxRewriter<MultipleRewriter>::parse((SyntaxRewriter<MultipleRewriter> *)this,text);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    SyntaxRewriter<MultipleRewriter>::insertBefore
              ((SyntaxRewriter<MultipleRewriter> *)this,(SyntaxNode *)t,pSVar3);
    sVar6 = parsing::Token::valueText(this_00);
    local_98.m_assertionInfo.macroName.m_start = sVar6._M_str;
    local_98.m_assertionInfo.macroName.m_size = sVar6._M_len;
    fmt_01.size_ = 0x4d;
    fmt_01.data_ = (char *)0x24;
    args_01.field_1.args_ = aVar4.args_;
    args_01.desc_ = (unsigned_long_long)&local_98;
    local_98.m_assertionInfo.lineInfo.file = pcVar5;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_c0,(v11 *)"\n    localparam int {}__count3 = {};",fmt_01,args_01);
    text_00._M_str = local_c0._M_dataplus._M_p;
    text_00._M_len = local_c0._M_string_length;
    pSVar3 = SyntaxRewriter<MultipleRewriter>::parse
                       ((SyntaxRewriter<MultipleRewriter> *)this,text_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    SyntaxRewriter<MultipleRewriter>::insertAfter
              ((SyntaxRewriter<MultipleRewriter> *)this,(SyntaxNode *)t,pSVar3);
    sVar6 = parsing::Token::valueText(this_00);
    local_98.m_assertionInfo.macroName.m_start = sVar6._M_str;
    local_98.m_assertionInfo.macroName.m_size = sVar6._M_len;
    fmt_02.size_ = 0x4d;
    fmt_02.data_ = (char *)0x24;
    args_02.field_1.args_ = aVar4.args_;
    args_02.desc_ = (unsigned_long_long)&local_98;
    local_98.m_assertionInfo.lineInfo.file = pcVar5;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_c0,(v11 *)"\n    localparam int {}__count4 = {};",fmt_02,args_02);
    text_01._M_str = local_c0._M_dataplus._M_p;
    text_01._M_len = local_c0._M_string_length;
    pSVar3 = SyntaxRewriter<MultipleRewriter>::parse
                       ((SyntaxRewriter<MultipleRewriter> *)this,text_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    SyntaxRewriter<MultipleRewriter>::insertAfter
              ((SyntaxRewriter<MultipleRewriter> *)this,(SyntaxNode *)t,pSVar3);
  }
  return;
}

Assistant:

void visit(T&& t) {
        if constexpr (requires { DERIVED->handle(t); })
            DERIVED->handle(t);
        else
            DERIVED->visitDefault(t);
    }